

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

string * gtest_crashFilescrashProblems_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<int> *info)

{
  bool bVar1;
  ParamGenerator<int> local_38;
  undefined1 local_28 [8];
  tuple<testing::internal::ParamGenerator<int>_> t;
  TestParamInfo<int> *info_local;
  
  t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>_>.
  super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)info;
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::internal::TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<int>const&)>
              (testing::internal::DefaultParamName<int>);
    testing::Range<int>((testing *)&local_38,1,0x1d);
    std::make_tuple<testing::internal::ParamGenerator<int>>((ParamGenerator<int> *)local_28);
    testing::internal::ParamGenerator<int>::~ParamGenerator(&local_38);
    std::tuple<testing::internal::ParamGenerator<int>_>::~tuple
              ((tuple<testing::internal::ParamGenerator<int>_> *)local_28);
  }
  testing::internal::DefaultParamName<int>
            (__return_storage_ptr__,
             (TestParamInfo<int> *)
             t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>_>.
             super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_
             .
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return __return_storage_ptr__;
}

Assistant:

TEST(fuzzFailures, timeouts)
{  // testing string that have caused a timeout from fuzz testing
    EXPECT_NO_THROW(unit_from_string("3*3*"));
    EXPECT_NO_THROW(unit_from_string("((())"));
}